

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_LIGHT_LEVEL(effect_handler_context_t_conflict *context)

{
  int iVar1;
  
  iVar1 = (context->value).base;
  if (iVar1 != 0) {
    msg("An image of your surroundings forms in your mind...");
  }
  wiz_light((chunk *)cave,player,iVar1 != 0);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_LIGHT_LEVEL(effect_handler_context_t *context)
{
	bool full = context->value.base ? true : false;
	if (full)
		msg("An image of your surroundings forms in your mind...");
	wiz_light(cave, player, full);
	context->ident = true;
	return true;
}